

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
duckdb::Connection::
CreateScalarFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
          (Connection *this,string *name,vector<duckdb::LogicalType,_true> *args,
          LogicalType *ret_type,_func_string_t_string_t_string_t_string_t *udf_func)

{
  type pCVar1;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *in_RCX;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *in_RDX;
  string *in_RSI;
  scalar_function_t function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffef8;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffff00;
  LogicalType local_e0 [16];
  _func_string_t_string_t_string_t_string_t *in_stack_ffffffffffffff30;
  LogicalType *in_stack_ffffffffffffff38;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  LogicalType local_a8 [24];
  undefined1 local_90 [40];
  string local_68 [88];
  string *local_10;
  
  local_10 = in_RSI;
  UDFWrapper::
  CreateScalarFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
  std::__cxx11::string::string(local_68,local_10);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  duckdb::LogicalType::LogicalType(local_a8,(LogicalType *)in_RCX);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (in_RCX,in_RDX);
  pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*(in_stack_ffffffffffffff00);
  duckdb::LogicalType::LogicalType(local_e0,INVALID);
  duckdb::UDFWrapper::RegisterFunction
            (local_68,local_90,local_a8,&stack0xffffffffffffff38,pCVar1,local_e0);
  duckdb::LogicalType::~LogicalType(local_e0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x4f92db);
  duckdb::LogicalType::~LogicalType(local_a8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x4f92ef);
  std::__cxx11::string::~string(local_68);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x4f9309);
  return;
}

Assistant:

void CreateScalarFunction(const string &name, vector<LogicalType> args, LogicalType ret_type,
	                          TR (*udf_func)(ARGS...)) {
		scalar_function_t function = UDFWrapper::CreateScalarFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		UDFWrapper::RegisterFunction(name, args, ret_type, function, *context);
	}